

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StoreLastParsedElement::operator()
          (StoreLastParsedElement *this,iterator_t *str,iterator_t *end)

{
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RDI;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffffee8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffffc8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffffd0;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::clear();
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::position_iterator(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=
            ((string *)((in_RDI->super_type).m_iterator.super_type.m_iterator.m_mem.px + 2),
             (string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeeb);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_RDI);
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::~position_iterator(in_RDI);
  *(undefined4 *)&(in_RDI->super_type).m_iterator.super_type.m_iterator.m_mem.px[4].data = 3;
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::StoreLastParsedElement::operator()(iterator_t str, iterator_t end) const
{ 
    _m_po->_m_lp_string.clear();
    _m_po->_m_lp_string = string(str, end);
    if(DEBUG_PARSE) cout << "Stored Last Parsed: string "<<
        _m_po->_m_lp_string << endl;
    _m_po->_m_lp_type = STRING;
}